

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

_Bool ra_has_run_container(roaring_array_t *ra)

{
  uint8_t uVar1;
  int *in_RDI;
  int32_t k;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (*in_RDI <= local_14) {
      return false;
    }
    uVar1 = get_container_type(*(container_t **)(*(long *)(in_RDI + 2) + (long)local_14 * 8),
                               *(uint8_t *)(*(long *)(in_RDI + 6) + (long)local_14));
    if (uVar1 == '\x03') break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

bool ra_has_run_container(const roaring_array_t *ra) {
    for (int32_t k = 0; k < ra->size; ++k) {
        if (get_container_type(ra->containers[k], ra->typecodes[k]) ==
            RUN_CONTAINER_TYPE)
            return true;
    }
    return false;
}